

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decimal64.c
# Opt level: O2

uint32_t decimal64IsCanonical(decimal64 *d64)

{
  decimal64 canon;
  decNumber_conflict2 dn;
  decContext dc;
  
  decContextDefault(&dc,0x40);
  decimal64ToNumber(d64,&dn);
  decimal64FromNumber(&canon,&dn,&dc);
  return (uint32_t)(*&d64->bytes == canon.bytes);
}

Assistant:

uint32_t decimal64IsCanonical(const decimal64 *d64) {
  decNumber dn;				/* work */
  decimal64 canon;			/* .. */
  decContext dc;			/* .. */
  decContextDefault(&dc, DEC_INIT_DECIMAL64);
  decimal64ToNumber(d64, &dn);
  decimal64FromNumber(&canon, &dn, &dc);/* canon will now be canonical */
  return memcmp(d64, &canon, DECIMAL64_Bytes)==0;
  }